

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureShadowTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::texture::anon_unknown_0::TextureCubeShadowTestInstance::iterate
          (TestStatus *__return_storage_ptr__,TextureCubeShadowTestInstance *this)

{
  TextureRenderer *this_00;
  ostringstream *poVar1;
  TestLog *log;
  TestContext *pTVar2;
  bool bVar3;
  deUint32 width;
  deUint32 height;
  int iVar4;
  TestTextureCube *pTVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int *piVar6;
  CubeFace face;
  pointer pFVar7;
  TextureFormat in_stack_fffffffffffffcc8;
  LodPrecision lodPrecision;
  vector<float,_std::allocator<float>_> texCoord;
  ScopedLogSection iterSection;
  undefined1 local_2c8 [32];
  int local_2a8;
  PixelFormat pixelFormat;
  Surface result;
  undefined1 local_248 [76];
  size_type sStack_1fc;
  size_type local_1f4;
  undefined4 uStack_1ec;
  CompareMode CStack_1e8;
  int local_1e4;
  anon_union_16_3_1194ccdc_for_v local_1e0;
  bool local_1d0;
  undefined7 uStack_1cf;
  LodMode local_1c8;
  undefined1 local_1b0 [32];
  int local_190;
  anon_union_16_3_1194ccdc_for_v local_18c [21];
  
  log = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_248,"Test",(allocator<char> *)&lodPrecision);
  de::toString<int>((string *)local_2c8,&this->m_caseNdx);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&texCoord,"Test ",(allocator<char> *)&stack0xfffffffffffffccf);
  de::toString<int>((string *)&pixelFormat,&this->m_caseNdx);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&texCoord,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pixelFormat);
  tcu::ScopedLogSection::ScopedLogSection(&iterSection,log,(string *)local_1b0,(string *)&result);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&pixelFormat);
  std::__cxx11::string::~string((string *)&texCoord);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::~string((string *)local_2c8);
  std::__cxx11::string::~string((string *)local_248);
  iVar4 = this->m_caseNdx;
  pFVar7 = (this->m_cases).
           super__Vector_base<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = &this->m_renderer;
  pTVar5 = util::TextureRenderer::getCubeTexture(this_00,pFVar7[iVar4].textureIndex);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_248,TEXTURETYPE_CUBE);
  util::createSampler((Sampler *)local_1b0,CLAMP_TO_EDGE,CLAMP_TO_EDGE,
                      (this->m_testParameters->super_TextureCubeTestCaseParameters).
                      super_TextureCommonTestCaseParameters.minFilter,
                      (this->m_testParameters->super_TextureCubeTestCaseParameters).
                      super_TextureCommonTestCaseParameters.magFilter);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1e4 = local_190;
  local_1f4 = local_1b0._16_8_;
  local_248._68_8_ = local_1b0._0_8_;
  sStack_1fc = local_1b0._8_8_;
  local_1e0._0_8_ = local_18c[0]._0_8_;
  local_1e0._8_8_ = local_18c[0]._8_8_;
  uStack_1cf = (undefined7)((ulong)local_18c[1]._0_8_ >> 8);
  local_1d0 = true;
  CStack_1e8 = (this->m_testParameters->super_TextureShadowCommonTestCaseParameters).compareOp;
  uStack_1ec = local_1b0._24_4_;
  local_248._4_4_ = SAMPLERTYPE_SHADOW;
  local_1c8 = LODMODE_EXACT;
  pFVar7 = pFVar7 + iVar4;
  local_248._32_4_ = pFVar7->ref;
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Compare reference value = ");
  std::ostream::operator<<(poVar1,(float)local_248._32_4_);
  std::operator<<((ostream *)poVar1,"\n");
  std::operator<<((ostream *)poVar1,"Coordinates: ");
  tcu::operator<<((ostream *)poVar1,&pFVar7->bottomLeft);
  std::operator<<((ostream *)poVar1," -> ");
  tcu::operator<<((ostream *)poVar1,&pFVar7->topRight);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  face = CUBEFACE_NEGATIVE_X;
  piVar6 = &DAT_009f2120;
  do {
    if (face == CUBEFACE_LAST) {
      iVar4 = this->m_caseNdx + 1;
      this->m_caseNdx = iVar4;
      if (iVar4 < (int)(((long)(this->m_cases).
                               super__Vector_base<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_cases).
                              super__Vector_base<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
        tcu::TestStatus::incomplete();
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1b0,"Pass",(allocator<char> *)local_2c8);
        tcu::TestStatus::pass(__return_storage_ptr__,(string *)local_1b0);
        std::__cxx11::string::~string((string *)local_1b0);
      }
LAB_00787cae:
      tcu::ScopedLogSection::~ScopedLogSection(&iterSection);
      return __return_storage_ptr__;
    }
    width = util::TextureRenderer::getRenderWidth(this_00);
    height = util::TextureRenderer::getRenderHeight(this_00);
    tcu::Surface::Surface(&result,width,height);
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    glu::TextureTestUtil::computeQuadTexCoordCube
              (&texCoord,face,&pFVar7->bottomLeft,&pFVar7->topRight);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Face ");
    std::operator<<((ostream *)poVar1,(char *)((long)&DAT_009f2120 + (long)*piVar6));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    util::TextureRenderer::renderQuad
              (this_00,&result,pFVar7->textureIndex,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(ReferenceParams *)local_248);
    ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
    pixelFormat = getPixelFormat(in_stack_fffffffffffffcc8);
    lodPrecision.rule = RULE_VULKAN;
    lodPrecision.derivateBits = 0x16;
    lodPrecision.lodBits = 0x10;
    tcu::TexComparePrecision::TexComparePrecision((TexComparePrecision *)local_2c8);
    lodPrecision.derivateBits = 10;
    lodPrecision.lodBits = 5;
    local_2c8._0_8_ = (pointer)0xa0000000a;
    local_2c8._8_4_ = 10;
    local_2c8._12_4_ = 6;
    local_2c8._16_4_ = 6;
    local_2c8._20_4_ = 0;
    local_2c8._24_4_ = 5;
    local_2c8._28_4_ = 0x10;
    local_2a8 = pixelFormat.redBits + -1;
    pTVar2 = ((this->super_TestInstance).m_context)->m_testCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,&result);
    iVar4 = (*(pTVar5->super_TestTexture)._vptr_TestTexture[0x10])(pTVar5);
    bVar3 = verifyTexCompareResult<tcu::TextureCube>
                      (pTVar2,(ConstPixelBufferAccess *)local_1b0,
                       (TextureCube *)CONCAT44(extraout_var,iVar4),
                       texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,(ReferenceParams *)local_248,
                       (TexComparePrecision *)local_2c8,&lodPrecision,&pixelFormat);
    if (!bVar3) {
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::operator<<((ostream *)(local_1b0 + 8),
                      "Warning: Verification assuming high-quality PCF filtering failed.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      lodPrecision.lodBits = 4;
      local_2c8._12_4_ = 4;
      local_2c8._16_4_ = 4;
      local_2c8._20_4_ = 0;
      local_2c8._24_4_ = 0;
      pTVar2 = ((this->super_TestInstance).m_context)->m_testCtx;
      tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,&result);
      iVar4 = (*(pTVar5->super_TestTexture)._vptr_TestTexture[0x10])(pTVar5);
      bVar3 = verifyTexCompareResult<tcu::TextureCube>
                        (pTVar2,(ConstPixelBufferAccess *)local_1b0,
                         (TextureCube *)CONCAT44(extraout_var_00,iVar4),
                         texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start,(ReferenceParams *)local_248,
                         (TexComparePrecision *)local_2c8,&lodPrecision,&pixelFormat);
      if (!bVar3) {
        poVar1 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,
                        "ERROR: Verification against low precision requirements failed, failing test case."
                       );
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1b0,"Image verification failed",
                   (allocator<char> *)&stack0xfffffffffffffccf);
        tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_1b0);
        std::__cxx11::string::~string((string *)local_1b0);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
        tcu::Surface::~Surface(&result);
        goto LAB_00787cae;
      }
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
    tcu::Surface::~Surface(&result);
    face = face + CUBEFACE_POSITIVE_X;
    piVar6 = piVar6 + 1;
  } while( true );
}

Assistant:

tcu::TestStatus TextureCubeShadowTestInstance::iterate (void)
{

	tcu::TestLog&						log				= m_context.getTestContext().getLog();
	const tcu::ScopedLogSection			iterSection		(log, string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));
	const FilterCase&					curCase			= m_cases[m_caseNdx];
	const pipeline::TestTextureCube&	texture			= m_renderer.getCubeTexture(curCase.textureIndex);

	ReferenceParams						sampleParams	(TEXTURETYPE_CUBE);

	// Params for reference computation.
	sampleParams.sampler					= util::createSampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, m_testParameters.minFilter, m_testParameters.magFilter);
	sampleParams.sampler.seamlessCubeMap	= true;
	sampleParams.sampler.compare			= m_testParameters.compareOp;
	sampleParams.samplerType				= SAMPLERTYPE_SHADOW;
	sampleParams.lodMode					= LODMODE_EXACT;
	sampleParams.ref						= curCase.ref;

	log	<< TestLog::Message
		<< "Compare reference value = " << sampleParams.ref << "\n"
		<< "Coordinates: " << curCase.bottomLeft << " -> " << curCase.topRight
		<< TestLog::EndMessage;

	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		const tcu::CubeFace		face		= tcu::CubeFace(faceNdx);
		tcu::Surface			result		(m_renderer.getRenderWidth(), m_renderer.getRenderHeight());
		vector<float>			texCoord;

		computeQuadTexCoordCube(texCoord, face, curCase.bottomLeft, curCase.topRight);

		log << TestLog::Message << "Face " << getFaceDesc(face) << TestLog::EndMessage;

		// \todo Log texture coordinates.

		m_renderer.renderQuad(result, curCase.textureIndex, &texCoord[0], sampleParams);

		{
			const tcu::PixelFormat		pixelFormat			= getPixelFormat(vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
			tcu::LodPrecision			lodPrecision		(tcu::LodPrecision::RULE_VULKAN);
			tcu::TexComparePrecision	texComparePrecision;

			lodPrecision.derivateBits			= 10;
			lodPrecision.lodBits				= 5;
			texComparePrecision.coordBits		= tcu::IVec3(10,10,10);
			texComparePrecision.uvwBits			= tcu::IVec3(6,6,0);
			texComparePrecision.pcfBits			= 5;
			texComparePrecision.referenceBits	= 16;
			texComparePrecision.resultBits		= pixelFormat.redBits-1;

			const bool isHighQuality = verifyTexCompareResult(m_context.getTestContext(), result.getAccess(), texture.getTexture(),
															  &texCoord[0], sampleParams, texComparePrecision, lodPrecision, pixelFormat);

			if (!isHighQuality)
			{
				log << TestLog::Message << "Warning: Verification assuming high-quality PCF filtering failed." << TestLog::EndMessage;

				lodPrecision.lodBits			= 4;
				texComparePrecision.uvwBits		= tcu::IVec3(4,4,0);
				texComparePrecision.pcfBits		= 0;

				const bool isOk = verifyTexCompareResult(m_context.getTestContext(), result.getAccess(), texture.getTexture(),
														 &texCoord[0], sampleParams, texComparePrecision, lodPrecision, pixelFormat);

				if (!isOk)
				{
					log << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
					return tcu::TestStatus::fail("Image verification failed");
				}
			}
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? tcu::TestStatus::incomplete() : tcu::TestStatus::pass("Pass");
}